

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O2

QRect __thiscall QSystemTrayIconSys::globalGeometry(QSystemTrayIconSys *this)

{
  QSize QVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.xp.m_i = 0;
  local_20.yp.m_i = 0;
  QVar2._0_8_ = QWidget::mapToGlobal((QWidget *)this,&local_20);
  QVar1 = QWidget::size((QWidget *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar2._8_8_ = (ulong)((QVar2.x1.m_i.m_i + QVar1.wd.m_i.m_i) - 1) |
                  (long)QVar1 + -0x100000000 + ((ulong)QVar2._0_8_ & 0xffffffff00000000) &
                  0xffffffff00000000;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QSystemTrayIconSys::globalGeometry() const
{
    return QRect(mapToGlobal(QPoint(0, 0)), size());
}